

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O0

int neverbleed_load_private_key_file(neverbleed_t *nb,SSL_CTX *ctx,char *fn,char *errbuf)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char *errstr;
  size_t curve_name;
  char *ec_pubkeystr;
  char *nstr;
  char *estr;
  EVP_PKEY *pkey;
  size_t type;
  size_t index;
  undefined1 local_58 [4];
  int ret;
  expbuf_t buf;
  st_neverbleed_thread_data_t *thdata;
  char *errbuf_local;
  char *fn_local;
  SSL_CTX *ctx_local;
  neverbleed_t *nb_local;
  
  buf.capacity = (size_t)get_thread_data(nb);
  memset(local_58,0,0x20);
  index._4_4_ = 1;
  expbuf_push_str((expbuf_t *)local_58,"load_key");
  expbuf_push_str((expbuf_t *)local_58,fn);
  iVar1 = expbuf_write((expbuf_t *)local_58,*(int *)(buf.capacity + 4));
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = "connection closed by daemon";
    if (*piVar2 != 0) {
      pcVar3 = "write error";
    }
    dief(pcVar3);
  }
  expbuf_dispose((expbuf_t *)local_58);
  iVar1 = expbuf_read((expbuf_t *)local_58,*(int *)(buf.capacity + 4));
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = "connection closed by daemon";
    if (*piVar2 != 0) {
      pcVar3 = "read error";
    }
    dief(pcVar3);
  }
  iVar1 = expbuf_shift_num((expbuf_t *)local_58,(size_t *)&pkey);
  if ((iVar1 != 0) || (iVar1 = expbuf_shift_num((expbuf_t *)local_58,&type), iVar1 != 0)) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    dief("failed to parse response");
  }
  if (pkey == (EVP_PKEY *)0x1) {
    nstr = expbuf_shift_str((expbuf_t *)local_58);
    if ((nstr == (char *)0x0) ||
       (ec_pubkeystr = expbuf_shift_str((expbuf_t *)local_58), ec_pubkeystr == (char *)0x0)) {
      piVar2 = __errno_location();
      *piVar2 = 0;
      dief("failed to parse response");
    }
    estr = (char *)create_pkey(nb,type,nstr,ec_pubkeystr);
  }
  else {
    if (pkey != (EVP_PKEY *)0x2) {
      pcVar3 = expbuf_shift_str((expbuf_t *)local_58);
      if (pcVar3 != (char *)0x0) {
        snprintf(errbuf,0x100,"%s",pcVar3);
        return -1;
      }
      piVar2 = __errno_location();
      *piVar2 = 0;
      dief("failed to parse response");
    }
    iVar1 = expbuf_shift_num((expbuf_t *)local_58,(size_t *)&errstr);
    if ((iVar1 != 0) ||
       (curve_name = (size_t)expbuf_shift_str((expbuf_t *)local_58),
       (char *)curve_name == (char *)0x0)) {
      piVar2 = __errno_location();
      *piVar2 = 0;
      dief("failed to parse response");
    }
    estr = (char *)ecdsa_create_pkey(nb,type,(int)errstr,(char *)curve_name);
  }
  expbuf_dispose((expbuf_t *)local_58);
  iVar1 = SSL_CTX_use_PrivateKey((SSL_CTX *)ctx,(EVP_PKEY *)estr);
  if (iVar1 != 1) {
    snprintf(errbuf,0x100,"SSL_CTX_use_PrivateKey failed");
    index._4_4_ = 0;
  }
  EVP_PKEY_free((EVP_PKEY *)estr);
  return index._4_4_;
}

Assistant:

int neverbleed_load_private_key_file(neverbleed_t *nb, SSL_CTX *ctx, const char *fn, char *errbuf)
{
    struct st_neverbleed_thread_data_t *thdata = get_thread_data(nb);
    struct expbuf_t buf = {NULL};
    int ret = 1;
    size_t index, type;
    EVP_PKEY *pkey;

    expbuf_push_str(&buf, "load_key");
    expbuf_push_str(&buf, fn);
    if (expbuf_write(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "write error" : "connection closed by daemon");
    expbuf_dispose(&buf);

    if (expbuf_read(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "read error" : "connection closed by daemon");
    if (expbuf_shift_num(&buf, &type) != 0 || expbuf_shift_num(&buf, &index) != 0) {
        errno = 0;
        dief("failed to parse response");
    }

    switch (type) {
    case NEVERBLEED_TYPE_RSA: {
        char *estr, *nstr;

        if ((estr = expbuf_shift_str(&buf)) == NULL || (nstr = expbuf_shift_str(&buf)) == NULL) {
            errno = 0;
            dief("failed to parse response");
        }
        pkey = create_pkey(nb, index, estr, nstr);
        break;
    }
#if OPENSSL_1_1_API
    case NEVERBLEED_TYPE_ECDSA: {
        char *ec_pubkeystr;
        size_t curve_name;

        if (expbuf_shift_num(&buf, &curve_name) != 0 || (ec_pubkeystr = expbuf_shift_str(&buf)) == NULL) {
            errno = 0;
            dief("failed to parse response");
        }
        pkey = ecdsa_create_pkey(nb, index, curve_name, ec_pubkeystr);
        break;
    }
#endif
    default: {
        char *errstr;

        if ((errstr = expbuf_shift_str(&buf)) == NULL) {
            errno = 0;
            dief("failed to parse response");
        }

        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "%s", errstr);
        return -1;
    }
    }

    expbuf_dispose(&buf);

    /* success */
    if (SSL_CTX_use_PrivateKey(ctx, pkey) != 1) {
        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "SSL_CTX_use_PrivateKey failed");
        ret = 0;
    }

    EVP_PKEY_free(pkey);
    return ret;
}